

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprk.c
# Opt level: O0

ARKodeSPRKTable arkodeSymplecticMcLachlan2(void)

{
  double dVar1;
  ARKodeSPRKTable sprk_table;
  int in_stack_ffffffffffffffec;
  ARKodeSPRKTable local_8;
  
  local_8 = ARKodeSPRKTable_Alloc(in_stack_ffffffffffffffec);
  if (local_8 == (ARKodeSPRKTable)0x0) {
    local_8 = (ARKodeSPRKTable)0x0;
  }
  else {
    local_8->q = 2;
    local_8->stages = 2;
    dVar1 = sqrt(2.0);
    local_8->a[1] = dVar1 * -0.5 + 1.0;
    *local_8->a = 1.0 - local_8->a[1];
    local_8->ahat[1] = 1.0 / ((1.0 - local_8->a[1]) * 2.0);
    *local_8->ahat = 1.0 - local_8->ahat[1];
  }
  return local_8;
}

Assistant:

static ARKodeSPRKTable arkodeSymplecticMcLachlan2(void)
{
  ARKodeSPRKTable sprk_table = ARKodeSPRKTable_Alloc(2);
  if (!sprk_table) { return NULL; }
  sprk_table->q      = 2;
  sprk_table->stages = 2;
  sprk_table->a[1]   = SUN_RCONST(1.0) - (SUN_RCONST(1.0) / SUN_RCONST(2.0)) *
                                         SUNRsqrt(SUN_RCONST(2.0));
  sprk_table->a[0]    = SUN_RCONST(1.0) - sprk_table->a[1];
  sprk_table->ahat[1] = SUN_RCONST(1.0) /
                        (SUN_RCONST(2.0) * (SUN_RCONST(1.0) - sprk_table->a[1]));
  sprk_table->ahat[0] = SUN_RCONST(1.0) - sprk_table->ahat[1];
  return sprk_table;
}